

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  CURLMcode CVar4;
  Curl_llist_node *n;
  Curl_easy *data;
  int iVar5;
  ulong uVar6;
  
  CVar4 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) {
    if ((multi->field_0x279 & 4) != 0) {
      return CURLM_RECURSIVE_API_CALL;
    }
    n = Curl_llist_head(&multi->process);
    iVar5 = -1;
    for (; n != (Curl_llist_node *)0x0; n = Curl_node_next(n)) {
      data = (Curl_easy *)Curl_node_elem(n);
      multi_getsock(data,&data->last_poll);
      uVar1 = (data->last_poll).num;
      for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
        iVar2 = (data->last_poll).sockets[uVar6];
        if (iVar2 < 0x400) {
          bVar3 = (data->last_poll).actions[uVar6];
          if ((bVar3 & 1) != 0) {
            read_fd_set->fds_bits[iVar2 / 0x40] =
                 read_fd_set->fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
            bVar3 = (data->last_poll).actions[uVar6];
          }
          if ((bVar3 & 2) != 0) {
            write_fd_set->fds_bits[iVar2 / 0x40] =
                 write_fd_set->fds_bits[iVar2 / 0x40] | 1L << ((byte)iVar2 & 0x3f);
          }
          if (iVar5 < iVar2) {
            iVar5 = iVar2;
          }
        }
      }
    }
    *max_fd = iVar5;
    CVar4 = CURLM_OK;
  }
  return CVar4;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    unsigned int i;

    multi_getsock(data, &data->last_poll);

    for(i = 0; i < data->last_poll.num; i++) {
      if(!FDSET_SOCK(data->last_poll.sockets[i]))
        /* pretend it does not exist */
        continue;
      if(data->last_poll.actions[i] & CURL_POLL_IN)
        FD_SET(data->last_poll.sockets[i], read_fd_set);
      if(data->last_poll.actions[i] & CURL_POLL_OUT)
        FD_SET(data->last_poll.sockets[i], write_fd_set);
      if((int)data->last_poll.sockets[i] > this_max_fd)
        this_max_fd = (int)data->last_poll.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}